

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

void spvc_compiler_set_member_name
               (spvc_compiler compiler,spvc_type_id id,uint member_index,char *argument)

{
  Compiler *this;
  allocator local_41;
  string local_40;
  
  this = (compiler->compiler)._M_t.
         super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>.
         _M_t.
         super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
         .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_40,argument,&local_41);
  spirv_cross::Compiler::set_member_name(this,(TypeID)id,member_index,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void spvc_compiler_set_member_name(spvc_compiler compiler, spvc_type_id id, unsigned member_index, const char *argument)
{
	compiler->compiler->set_member_name(id, member_index, argument);
}